

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O1

PropertyIndex __thiscall
Js::RootObjectBase::GetRootPropertyIndex(RootObjectBase *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  PropertyRecord *pPVar6;
  
  if ((uint)propertyId < 0x10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0xd1,"(!Js::IsInternalPropertyId(propertyId))",
                                "!Js::IsInternalPropertyId(propertyId)");
    if (!bVar2) goto LAB_00d55452;
    *puVar4 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0xd2,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
LAB_00d55452:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pDVar5 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  pPVar6 = ScriptContext::GetPropertyName
                     ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                      propertyId);
  iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x1e])(pDVar5,pPVar6);
  return (PropertyIndex)iVar3;
}

Assistant:

PropertyIndex
    RootObjectBase::GetRootPropertyIndex(PropertyId propertyId)
    {
        Assert(!Js::IsInternalPropertyId(propertyId));
        Assert(propertyId != Constants::NoProperty);
        return GetTypeHandler()->GetRootPropertyIndex(this->GetScriptContext()->GetPropertyName(propertyId));
    }